

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFloatFormat.cpp
# Opt level: O1

Interval * __thiscall
tcu::FloatFormat::convert(Interval *__return_storage_ptr__,FloatFormat *this,Interval *x)

{
  YesNoMaybe YVar1;
  undefined1 uVar2;
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  double dVar6;
  double dVar7;
  Interval local_60;
  Interval local_48;
  
  __return_storage_ptr__->m_hasNaN = false;
  __return_storage_ptr__->m_lo = INFINITY;
  __return_storage_ptr__->m_hi = -INFINITY;
  dVar6 = x->m_lo;
  dVar7 = x->m_hi;
  if (x->m_hasNaN == true) {
    YVar1 = this->m_hasNaN;
    if (YVar1 != NO) {
      __return_storage_ptr__->m_hasNaN = true;
      __return_storage_ptr__->m_lo = INFINITY;
      __return_storage_ptr__->m_hi = -INFINITY;
      if (YVar1 == YES) goto LAB_001d5549;
    }
    dVar7 = INFINITY;
    dVar6 = -INFINITY;
  }
LAB_001d5549:
  if (dVar6 <= dVar7) {
    dVar6 = round(this,dVar6);
    clampValue(&local_48,this,dVar6);
    dVar6 = round(this,dVar7);
    clampValue(&local_60,this,dVar6);
    dVar7 = (double)(~-(ulong)(local_48.m_lo <= local_60.m_lo) & (ulong)local_60.m_lo |
                    (ulong)local_48.m_lo & -(ulong)(local_48.m_lo <= local_60.m_lo));
    dVar6 = (double)(~-(ulong)(local_60.m_hi <= local_48.m_hi) & (ulong)local_60.m_hi |
                    (ulong)local_48.m_hi & -(ulong)(local_60.m_hi <= local_48.m_hi));
    bVar3 = true;
    if (((local_48.m_hasNaN | __return_storage_ptr__->m_hasNaN) & 1U) == 0) {
      bVar3 = local_60.m_hasNaN;
    }
    uVar4 = -(ulong)(__return_storage_ptr__->m_lo <= dVar7);
    uVar5 = -(ulong)(dVar6 <= __return_storage_ptr__->m_hi);
    __return_storage_ptr__->m_hasNaN = bVar3;
    __return_storage_ptr__->m_lo =
         (double)(uVar4 & (ulong)__return_storage_ptr__->m_lo | ~uVar4 & (ulong)dVar7);
    __return_storage_ptr__->m_hi =
         (double)(uVar5 & (ulong)__return_storage_ptr__->m_hi | ~uVar5 & (ulong)dVar6);
  }
  if (this->m_exactPrecision == false) {
    uVar2 = true;
    if (__return_storage_ptr__->m_hasNaN == false) {
      uVar2 = (undefined1)*(undefined4 *)x;
    }
    dVar6 = x->m_lo;
    dVar7 = x->m_hi;
    uVar4 = -(ulong)(__return_storage_ptr__->m_lo <= dVar6);
    uVar5 = -(ulong)(dVar7 <= __return_storage_ptr__->m_hi);
    __return_storage_ptr__->m_hasNaN = (bool)uVar2;
    __return_storage_ptr__->m_lo =
         (double)(~uVar4 & (ulong)dVar6 | (ulong)__return_storage_ptr__->m_lo & uVar4);
    __return_storage_ptr__->m_hi =
         (double)(~uVar5 & (ulong)dVar7 | (ulong)__return_storage_ptr__->m_hi & uVar5);
  }
  return __return_storage_ptr__;
}

Assistant:

Interval FloatFormat::convert (const Interval& x) const
{
	Interval ret;
	Interval tmp = x;

	if (x.hasNaN())
	{
		// If NaN might be supported, NaN is a legal return value
		if (m_hasNaN != NO)
			ret |= TCU_NAN;

		// If NaN might not be supported, any (non-NaN) value is legal,
		// _subject_ to clamping. Hence we modify tmp, not ret.
		if (m_hasNaN != YES)
			tmp = Interval::unbounded();
	}

	// Round both bounds _inwards_ to closest representable values.
	if (!tmp.empty())
		ret |= clampValue(round(tmp.lo(), true)) | clampValue(round(tmp.hi(), false));

	// If this format's precision is not exact, the (possibly out-of-bounds)
	// original value is also a possible result.
	if (!m_exactPrecision)
		ret |= x;

	return ret;
}